

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

CloudNode * Cloud_bddOr(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  byte bVar1;
  CloudCacheEntry2 *pCVar2;
  CloudNode *pCVar3;
  CloudNode *pCVar4;
  CloudNode *f_00;
  
  if ((f < (CloudNode *)0x2) || (g < (CloudNode *)0x2)) {
    pCVar3 = (CloudNode *)0x0;
  }
  else {
    pCVar3 = dd->tUnique;
    if ((f < pCVar3) || (pCVar3 + dd->nNodesAlloc <= f)) {
      __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                    ,0x204,"CloudNode *Cloud_bddOr(CloudManager *, CloudNode *, CloudNode *)");
    }
    if ((g < pCVar3) || (pCVar3 + dd->nNodesAlloc <= g)) {
      __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                    ,0x205,"CloudNode *Cloud_bddOr(CloudManager *, CloudNode *, CloudNode *)");
    }
    if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
      bVar1 = (byte)dd->bitsCache[0];
      pCVar2 = (CloudCacheEntry2 *)calloc((long)(1 << (bVar1 & 0x1f)),0x20);
      dd->tCaches[0] = pCVar2;
      dd->nMemUsed = dd->nMemUsed + (0x20 << (bVar1 & 0x1f));
    }
    f_00 = (CloudNode *)((ulong)f ^ 1);
    pCVar4 = (CloudNode *)((ulong)g ^ 1);
    pCVar3 = pCVar4;
    if (pCVar4 < f_00) {
      pCVar3 = f_00;
      f_00 = pCVar4;
    }
    pCVar3 = cloudBddAnd(dd,f_00,pCVar3);
    pCVar3 = (CloudNode *)((ulong)(pCVar3 != (CloudNode *)0x0) ^ (ulong)pCVar3);
  }
  return pCVar3;
}

Assistant:

CloudNode * Cloud_bddOr( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * res;
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    res = cloudBddAnd_gate( dd, Cloud_Not(f), Cloud_Not(g) );
    res = Cloud_NotCond( res, res != NULL );
    return res;
}